

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

curltime Curl_now(void)

{
  int iVar1;
  curltime cVar2;
  undefined1 local_38 [8];
  timespec tsnow;
  timeval now;
  curltime cnow;
  
  iVar1 = clock_gettime(1,(timespec *)local_38);
  if (iVar1 == 0) {
    now.tv_usec = (__suseconds_t)local_38;
    cnow.tv_sec._0_4_ = (undefined4)(tsnow.tv_sec / 1000);
  }
  else {
    gettimeofday((timeval *)&tsnow.tv_nsec,(__timezone_ptr_t)0x0);
    now.tv_usec = tsnow.tv_nsec;
    cnow.tv_sec._0_4_ = (undefined4)now.tv_sec;
  }
  cVar2.tv_usec = (undefined4)cnow.tv_sec;
  cVar2.tv_sec = now.tv_usec;
  cVar2._12_4_ = 0;
  return cVar2;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  struct curltime ret;
  (void)gettimeofday(&now, NULL);
  ret.tv_sec = now.tv_sec;
  ret.tv_usec = (int)now.tv_usec;
  return ret;
}